

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::
SmallVectorBase<std::pair<std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>>::
emplaceRealloc<std::pair<std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>>
          (SmallVectorBase<std::pair<std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>>
           *this,pointer pos,
          pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*> *args)

{
  ulong uVar1;
  pointer p;
  unsigned_long uVar2;
  unsigned_long *puVar3;
  long lVar4;
  unsigned_long *puVar5;
  pointer ppVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  if (*(long *)(this + 8) == 0x555555555555555) {
    detail::throwLengthError();
  }
  uVar9 = *(long *)(this + 8) + 1;
  uVar1 = *(ulong *)(this + 0x10);
  if (uVar9 < uVar1 * 2) {
    uVar9 = uVar1 * 2;
  }
  if (0x555555555555555 - uVar1 < uVar1) {
    uVar9 = 0x555555555555555;
  }
  lVar7 = (long)pos - *(long *)this;
  puVar3 = (unsigned_long *)operator_new(uVar9 * 0x18);
  *(ValueDriver **)((long)puVar3 + lVar7 + 0x10) = args->second;
  uVar2 = (args->first).second;
  *(unsigned_long *)((long)puVar3 + lVar7) = (args->first).first;
  ((unsigned_long *)((long)puVar3 + lVar7))[1] = uVar2;
  p = *(pointer *)this;
  lVar8 = *(long *)(this + 8);
  lVar4 = (long)p + (lVar8 * 0x18 - (long)pos);
  ppVar6 = p;
  puVar5 = puVar3;
  if (lVar4 == 0) {
    if (lVar8 != 0) {
      do {
        puVar5[2] = (unsigned_long)ppVar6->second;
        uVar2 = (ppVar6->first).second;
        *puVar5 = (ppVar6->first).first;
        puVar5[1] = uVar2;
        ppVar6 = ppVar6 + 1;
        puVar5 = puVar5 + 3;
      } while (ppVar6 != pos);
    }
  }
  else {
    for (; ppVar6 != pos; ppVar6 = ppVar6 + 1) {
      puVar5[2] = (unsigned_long)ppVar6->second;
      uVar2 = (ppVar6->first).second;
      *puVar5 = (ppVar6->first).first;
      puVar5[1] = uVar2;
      puVar5 = puVar5 + 3;
    }
    memcpy((void *)((long)puVar3 + lVar7 + 0x18),pos,((lVar4 - 0x18U) / 0x18) * 0x18 + 0x18);
  }
  if (p != (pointer)(this + 0x18)) {
    operator_delete(p);
    lVar8 = *(long *)(this + 8);
  }
  *(long *)(this + 8) = lVar8 + 1;
  *(ulong *)(this + 0x10) = uVar9;
  *(unsigned_long **)this = puVar3;
  return (pointer)((long)puVar3 + lVar7);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}